

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int * int_list_dup(int *aa)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  size_t __size;
  
  __size = 0;
  do {
    piVar3 = (int *)((long)aa + __size);
    __size = __size + 4;
  } while (*piVar3 != -1);
  piVar1 = (int *)malloc(__size);
  iVar2 = *aa;
  piVar3 = piVar1;
  if (iVar2 != -1) {
    piVar4 = aa + 1;
    do {
      *piVar3 = iVar2;
      piVar3 = piVar3 + 1;
      iVar2 = *piVar4;
      piVar4 = piVar4 + 1;
    } while (iVar2 != -1);
  }
  *piVar3 = -1;
  return piVar1;
}

Assistant:

int *int_list_dup(int *aa) {
  int *a = aa, *b, *bb;
  while (*a != -1) {
    a++;
  }
  bb = b = (int *)MALLOC((a - aa + 1) * sizeof(int));
  a = aa;
  while (*a != -1) {
    *b++ = *a++;
  }
  *b++ = -1;
  return bb;
}